

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_lower_bound.cpp
# Opt level: O3

void test<std::vector<long,std::allocator<long>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>(*)(__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long_const&)>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempts,
               _func___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>_long_ptr
               *lower_bound,string *name)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var1;
  pointer plVar2;
  pointer plVar3;
  long lVar4;
  clock_t cVar5;
  clock_t cVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  long number;
  double local_50;
  long local_38;
  
  if (attempts == 0) {
    local_50 = 0.0;
  }
  else {
    lVar9 = 0;
    sVar8 = attempts;
    do {
      plVar2 = (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = random();
      plVar3 = (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      _Var1._M_current =
           plVar2 + lVar4 % (((long)plVar3 -
                              (long)(numbers->super__Vector_base<long,_std::allocator<long>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 3) + -1);
      dVar10 = (double)((long)plVar3 - (long)_Var1._M_current >> 3);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      lVar4 = random();
      local_38 = _Var1._M_current
                 [lVar4 % ((long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f |
                          (long)dVar10)];
      cVar5 = clock();
      (*lower_bound)(_Var1,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                            )(numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                             super__Vector_impl_data._M_finish,&local_38);
      cVar6 = clock();
      lVar9 = (lVar9 - cVar5) + cVar6;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
    local_50 = (double)lVar9;
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_1172c,0x18);
  poVar7 = std::ostream::_M_insert<double>(local_50 / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_11745,0x1c);
  auVar11._8_4_ = (int)(attempts >> 0x20);
  auVar11._0_8_ = attempts;
  auVar11._12_4_ = 0x45300000;
  poVar7 = std::ostream::_M_insert<double>
                     ((local_50 /
                      ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)attempts) - 4503599627370496.0))) /
                      1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void test (const Container & numbers, std::size_t attempts, Function lower_bound, const std::string & name)
{
    clock_t total_time = 0;

    for (std::size_t attempt = 0; attempt < attempts; ++attempt)
    {
        using difference_type = typename Container::difference_type;
        auto search_start = numbers.begin() + random() % static_cast<difference_type>(numbers.size() - 1);
        auto search_position = static_cast<std::size_t>(std::sqrt(std::distance(search_start, numbers.end())));
        auto search_element = search_start + random() % static_cast<difference_type>(search_position);
        auto number = *search_element;

        clock_t attempt_time = clock();
        lower_bound(search_start, numbers.end(), number);
        attempt_time = clock() - attempt_time;
        total_time += attempt_time;
    }

    std::cout << name << ":" << std::endl;
    std::cout << "\tОбщее время: " << static_cast<double>(total_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время: " << static_cast<double>(total_time) / static_cast<double>(attempts) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}